

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_request_state(Curl_easy *data,_Bool *done)

{
  curl_off_t *pcVar1;
  connectdata *conn;
  smb_request *psVar2;
  char *pcVar3;
  char *__s;
  curl_off_t cVar4;
  smb_header *h;
  curl_pp_transfer cVar5;
  void *pvVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  CURLcode CVar9;
  CURLcode CVar10;
  uint uVar11;
  size_t sVar12;
  size_t sVar13;
  ulong blen;
  long lVar14;
  long lVar15;
  size_t upload_size;
  void *msg;
  smb_request *local_470;
  undefined1 local_464;
  undefined1 uStack_463;
  undefined1 local_462;
  undefined2 uStack_461;
  undefined1 uStack_45f;
  undefined1 uStack_45e;
  undefined1 uStack_45d;
  undefined1 uStack_45c;
  undefined2 uStack_45b;
  undefined2 uStack_459;
  char acStack_457 [3];
  undefined2 uStack_454;
  undefined1 uStack_452;
  undefined1 uStack_451;
  undefined1 uStack_450;
  undefined4 uStack_44f;
  undefined2 uStack_44b;
  char local_444 [4];
  int local_440;
  short local_433;
  char local_431 [1025];
  
  conn = data->conn;
  psVar2 = (data->req).p.smb;
  msg = (void *)0x0;
  if ((((data->state).field_0x74e & 0x10) != 0) && ((data->state).infilesize < 0)) {
    Curl_failf(data,"SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }
  if (psVar2->state == SMB_REQUESTING) {
    pcVar3 = (conn->host).name;
    sVar12 = strlen(pcVar3);
    __s = (conn->proto).smbc.share;
    sVar13 = strlen(__s);
    if ((sVar13 + sVar12) - 0x3f7 < 0xfffffffffffffbff) {
      CVar9 = CURLE_FILESIZE_EXCEEDED;
      goto LAB_00579c8a;
    }
    memset(&local_462,0,0x409);
    local_464 = 4;
    uStack_463 = 0xff;
    uStack_459 = 0x5c5c;
    acStack_457[0] = '\0';
    strcpy(acStack_457,pcVar3);
    sVar12 = strlen(pcVar3);
    (acStack_457 + sVar12)[0] = '\\';
    (acStack_457 + sVar12)[1] = '\0';
    strcpy(acStack_457 + sVar12 + 1,__s);
    sVar13 = strlen(__s);
    builtin_strncpy(acStack_457 + sVar13 + sVar12 + 2,"????",4);
    *(undefined2 *)(&uStack_451 + sVar13 + sVar12) = 0x3f;
    uStack_45b = (short)(acStack_457 + ((sVar13 + sVar12) - (long)&uStack_459) + 1) + 7;
    CVar9 = smb_send_message(data,'u',&local_464,
                             (size_t)(acStack_457 + ((sVar13 + sVar12) - (long)&uStack_459) + 1 +
                                     0x12));
    if (CVar9 != CURLE_OK) goto LAB_00579c8a;
    ((data->req).p.imap)->transfer = PPTRANSFER_INFO;
  }
  CVar9 = smb_send_and_recv(data,&msg);
  pvVar6 = msg;
  if ((CVar9 != CURLE_OK) && (CVar9 != CURLE_AGAIN)) {
LAB_00579c8a:
    Curl_conncontrol(conn,1);
    return CVar9;
  }
  CVar9 = CURLE_OK;
  if (msg == (void *)0x0) {
    return CURLE_OK;
  }
  switch(psVar2->state) {
  case SMB_TREE_CONNECT:
    if (*(int *)((long)msg + 9) != 0) {
      CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (*(int *)((long)msg + 9) == 0x50001) {
        CVar10 = CURLE_REMOTE_ACCESS_DENIED;
      }
      psVar2->result = CVar10;
      goto LAB_00579de3;
    }
    psVar2->tid = *(unsigned_short *)((long)msg + 0x1c);
    (conn->proto).ftpc.pp.sendbuf.allc = 0;
    pcVar3 = ((data->req).p.file)->freepath;
    sVar12 = strlen(pcVar3);
    if (sVar12 - 0x400 < 0xfffffffffffffbff) {
      CVar10 = CURLE_FILESIZE_EXCEEDED;
    }
    else {
      memset(&local_462,0,0x431);
      local_464 = 0x18;
      uStack_463 = 0xff;
      uStack_45e = (undefined1)sVar12;
      uStack_45d = (undefined1)(sVar12 >> 8);
      local_444[0] = '\a';
      local_444[1] = '\0';
      local_444[2] = '\0';
      local_444[3] = '\0';
      uVar11 = *(uint *)&(data->state).field_0x74c >> 0x14 & 1;
      local_440 = uVar11 * 4 + 1;
      uStack_454 = 0;
      uStack_452 = 0;
      uStack_451 = (undefined1)((uVar11 - 2) * 0x40000000 >> 0x18);
      local_433 = (short)sVar12 + 1;
      strcpy(local_431,pcVar3);
      CVar10 = smb_send_message(data,0xa2,&local_464,sVar12 + 0x34);
    }
    cVar5 = PPTRANSFER_NONE;
    break;
  case SMB_OPEN:
    if ((*(int *)((long)msg + 9) != 0) || ((conn->proto).ftpc.pp.sendbuf.allc < 100)) {
      CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (*(int *)((long)msg + 9) == 0x50001) {
        CVar10 = CURLE_REMOTE_ACCESS_DENIED;
      }
      psVar2->result = CVar10;
      goto switchD_00579b57_caseD_5;
    }
    psVar2->fid = *(unsigned_short *)((long)msg + 0x2a);
    (data->req).offset = 0;
    if (((data->state).field_0x74e & 0x10) == 0) {
      lVar14 = *(long *)((long)msg + 0x5c);
      (data->req).size = lVar14;
      if (lVar14 < 0) {
        CVar10 = CURLE_WEIRD_SERVER_REPLY;
        goto LAB_0057a09d;
      }
      Curl_pgrsSetDownloadSize(data,lVar14);
      if (((data->set).field_0x8ba & 0x80) != 0) {
        (data->info).filetime = (*(long *)((long)pvVar6 + 0x48) + -0x19db1ded53e8000) / 10000000;
      }
LAB_0057a03b:
      (conn->proto).ftpc.pp.sendbuf.allc = 0;
      cVar4 = (data->req).offset;
      uStack_452 = 0;
      uStack_451 = 0;
      uStack_450 = 0;
      uStack_44b = 0;
      local_462 = 0;
      uStack_461 = 0;
      acStack_457[2] = 0;
      uStack_454 = 0;
      local_464 = 0xc;
      uStack_463 = 0xff;
      uVar7 = ((data->req).p.smb)->fid;
      uStack_45f = (undefined1)uVar7;
      uStack_45e = (undefined1)(uVar7 >> 8);
      uStack_45d = (undefined1)cVar4;
      uStack_45c = (undefined1)((ulong)cVar4 >> 8);
      uStack_45b._0_1_ = (undefined1)((ulong)cVar4 >> 0x10);
      uStack_45b._1_1_ = (undefined1)((ulong)cVar4 >> 0x18);
      uStack_44f = (undefined4)((ulong)cVar4 >> 0x20);
      uStack_459 = 0x8000;
      acStack_457[0] = '\0';
      acStack_457[1] = 0x80;
      CVar10 = smb_send_message(data,'.',&local_464,0x1b);
      cVar5 = PPTRANSFER_NONE|PPTRANSFER_INFO;
      break;
    }
    cVar4 = (data->state).infilesize;
    (data->req).size = cVar4;
    Curl_pgrsSetUploadSize(data,cVar4);
    lVar14 = (data->req).size;
    lVar15 = (data->req).bytecount;
LAB_00579f54:
    (conn->proto).ftpc.pp.sendbuf.allc = 0;
    cVar4 = (data->req).offset;
    local_470 = (data->req).p.smb;
    CVar10 = Curl_get_upload_buffer(data);
    if (CVar10 == CURLE_OK) {
      upload_size = lVar14 - lVar15;
      if (0x7ffe < (long)upload_size) {
        upload_size = 0x7fff;
      }
      h = (smb_header *)(data->state).ulbuf;
      *(undefined8 *)&h->uid = 0;
      *(undefined8 *)h[1].magic = 0;
      *(undefined8 *)((long)&h[1].status + 3) = 0;
      *(undefined8 *)(h[1].signature + 2) = 0;
      h->pid_high = 0;
      h->signature[0] = '\0';
      h->signature[1] = '\0';
      h->signature[2] = '\0';
      h->signature[3] = '\0';
      h->signature[4] = '\0';
      h->signature[5] = '\0';
      *(undefined8 *)(h->signature + 6) = 0;
      h[1].tid = 0;
      h[1].pid = 0;
      h->nbt_type = '\0';
      h->nbt_flags = '\0';
      h->nbt_length = 0;
      h->magic[0] = '\0';
      h->magic[1] = '\0';
      h->magic[2] = '\0';
      h->magic[3] = '\0';
      h->command = '\0';
      h->status = 0;
      h->flags = '\0';
      h->flags2 = 0;
      h[1].nbt_type = '\x0e';
      h[1].nbt_flags = 0xff;
      *(unsigned_short *)(h[1].magic + 1) = local_470->fid;
      *(int *)(h[1].magic + 3) = (int)cVar4;
      *(int *)(h[1].signature + 7) = (int)((ulong)cVar4 >> 0x20);
      *(short *)(h[1].signature + 3) = (short)upload_size;
      h[1].signature[5] = '@';
      h[1].signature[6] = '\0';
      *(short *)((long)&h[1].tid + 1) = (short)upload_size + 1;
      smb_format_message(data,h,'/',upload_size + 0x20);
      CVar10 = smb_send(data,0x44,upload_size);
      cVar5 = 4;
      break;
    }
    goto LAB_0057a0e7;
  case SMB_DOWNLOAD:
    CVar10 = CURLE_RECV_ERROR;
    if ((*(int *)((long)msg + 9) == 0) && (0x31 < (conn->proto).ftpc.pp.sendbuf.allc)) {
      uVar7 = Curl_read16_le((uchar *)((long)msg + 0x2f));
      uVar8 = Curl_read16_le((uchar *)((long)pvVar6 + 0x31));
      if (uVar7 == 0) {
        blen = 0;
LAB_0057a02e:
        pcVar1 = &(data->req).offset;
        *pcVar1 = *pcVar1 + blen;
        if ((short)uVar7 < 0) goto LAB_0057a03b;
        goto LAB_0057a0a1;
      }
      blen = (ulong)uVar7;
      if ((conn->proto).ftpc.pp.sendbuf.allc < blen + uVar8 + 4) {
        Curl_failf(data,"Invalid input packet");
      }
      else {
        CVar10 = Curl_client_write(data,1,(char *)((long)pvVar6 + (ulong)uVar8 + 4),blen);
        if (CVar10 == CURLE_OK) goto LAB_0057a02e;
      }
    }
LAB_0057a09d:
    psVar2->result = CVar10;
    goto LAB_0057a0a1;
  case SMB_UPLOAD:
    CVar10 = CURLE_UPLOAD_FAILED;
    if ((*(int *)((long)msg + 9) != 0) || ((conn->proto).ftpc.pp.sendbuf.allc < 0x2a))
    goto LAB_0057a09d;
    uVar7 = Curl_read16_le((uchar *)((long)msg + 0x29));
    lVar14 = (data->req).bytecount + (ulong)uVar7;
    (data->req).bytecount = lVar14;
    pcVar1 = &(data->req).offset;
    *pcVar1 = *pcVar1 + (ulong)uVar7;
    Curl_pgrsSetUploadCounter(data,lVar14);
    lVar14 = (data->req).size;
    lVar15 = (data->req).bytecount;
    if (lVar15 < lVar14) goto LAB_00579f54;
LAB_0057a0a1:
    (conn->proto).ftpc.pp.sendbuf.allc = 0;
    uStack_45d = 0;
    uStack_45c = 0;
    uStack_461 = 0;
    uStack_45f = 0;
    uStack_45e = 0;
    local_464 = 3;
    uVar7 = ((data->req).p.smb)->fid;
    uStack_463 = (undefined1)uVar7;
    local_462 = (undefined1)(uVar7 >> 8);
    CVar10 = smb_send_message(data,'\x04',&local_464,9);
    cVar5 = 5;
    break;
  case SMB_CLOSE:
switchD_00579b57_caseD_5:
    (conn->proto).ftpc.pp.sendbuf.allc = 0;
    local_462 = 0;
    local_464 = 0;
    uStack_463 = 0;
    CVar10 = smb_send_message(data,'q',&local_464,3);
    cVar5 = 6;
    break;
  case SMB_TREE_DISCONNECT:
    CVar10 = psVar2->result;
LAB_00579de3:
    (conn->proto).ftpc.pp.sendbuf.allc = 0;
    *done = true;
    cVar5 = 7;
    break;
  default:
    (conn->proto).ftpc.pp.sendbuf.allc = 0;
    return CURLE_OK;
  }
  if (CVar10 == CURLE_OK) {
    ((data->req).p.imap)->transfer = cVar5;
  }
  else {
LAB_0057a0e7:
    CVar9 = CVar10;
    Curl_conncontrol(conn,1);
  }
  return CVar9;
}

Assistant:

static CURLcode smb_request_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_request *req = data->req.p.smb;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  if(data->state.upload && (data->state.infilesize < 0)) {
    failf(data, "SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(data);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(data, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    data->req.offset = 0;
    if(data->state.upload) {
      data->req.size = data->state.infilesize;
      Curl_pgrsSetUploadSize(data, data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      data->req.size = smb_swap64(smb_m->end_of_file);
      if(data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(data, data->req.size);
        if(data->set.get_filetime)
          get_posix_time(&data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    data->req.offset += len;
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    data->req.bytecount += len;
    data->req.offset += len;
    Curl_pgrsSetUploadCounter(data, data->req.bytecount);
    if(data->req.bytecount >= data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We don't care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(data);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(data);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(data);
    break;

  case SMB_CLOSE:
    result = smb_send_close(data);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(data);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(data, next_state);

  return CURLE_OK;
}